

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

void __thiscall
flatbuffers::python::anon_unknown_0::PythonStubGenerator::GenerateStructStub
          (PythonStubGenerator *this,stringstream *stub,StructDef *struct_def,Imports *imports)

{
  undefined8 uVar1;
  bool bVar2;
  ostream *poVar3;
  long lVar4;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *this_00;
  reference ppFVar5;
  Import *pIVar6;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_1e0;
  string local_1c0;
  Import *local_1a0;
  Import *import_2;
  StructDef *nested_def;
  string local_170;
  string local_150;
  Import *local_130;
  Import *import_1;
  string local_108;
  string local_e8;
  Import *local_c8;
  Import *import;
  Type *local_a0;
  Type *field_type;
  string name;
  FieldDef *field;
  const_iterator __end3;
  const_iterator __begin3;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *__range3;
  undefined1 local_48 [8];
  string type;
  Imports *imports_local;
  StructDef *struct_def_local;
  stringstream *stub_local;
  PythonStubGenerator *this_local;
  
  type.field_2._8_8_ = imports;
  IdlNamer::Type_abi_cxx11_((string *)local_48,&this->namer_,struct_def);
  poVar3 = std::operator<<((ostream *)(stub + 0x10),"class ");
  std::operator<<(poVar3,(string *)local_48);
  if ((this->version_).major != 3) {
    std::operator<<((ostream *)(stub + 0x10),"(object)");
  }
  std::operator<<((ostream *)(stub + 0x10),":\n");
  if ((struct_def->fixed & 1U) == 0) {
    std::operator<<((ostream *)(stub + 0x10),"  @classmethod\n");
    poVar3 = std::operator<<((ostream *)(stub + 0x10),
                             "  def GetRootAs(cls, buf: bytes, offset: int) -> ");
    poVar3 = std::operator<<(poVar3,(string *)local_48);
    std::operator<<(poVar3,": ...\n");
    if (((this->parser_->opts).python_no_type_prefix_suffix & 1U) == 0) {
      std::operator<<((ostream *)(stub + 0x10),"  @classmethod\n");
      poVar3 = std::operator<<((ostream *)(stub + 0x10),"  def GetRootAs");
      poVar3 = std::operator<<(poVar3,(string *)local_48);
      poVar3 = std::operator<<(poVar3,"(cls, buf: bytes, offset: int) -> ");
      poVar3 = std::operator<<(poVar3,(string *)local_48);
      std::operator<<(poVar3,": ...\n");
    }
    lVar4 = std::__cxx11::string::length();
    if (lVar4 != 0) {
      std::operator<<((ostream *)(stub + 0x10),"  @classmethod\n");
      poVar3 = std::operator<<((ostream *)(stub + 0x10),"  def ");
      poVar3 = std::operator<<(poVar3,(string *)local_48);
      std::operator<<(poVar3,
                      "BufferHasIdentifier(cls, buf: bytes, offset: int, size_prefixed: bool) -> bool: ...\n"
                     );
    }
  }
  else {
    std::operator<<((ostream *)(stub + 0x10),"  @classmethod\n");
    std::operator<<((ostream *)(stub + 0x10),"  def SizeOf(cls) -> int: ...\n\n");
  }
  std::operator<<((ostream *)(stub + 0x10),"  def Init(self, buf: bytes, pos: int) -> None: ...\n");
  this_00 = &(struct_def->fields).vec;
  __end3 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                     (this_00);
  field = (FieldDef *)
          std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                    (this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end3,(__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                                     *)&field), bVar2) {
    ppFVar5 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&__end3);
    name.field_2._8_8_ = *ppFVar5;
    if ((((FieldDef *)name.field_2._8_8_)->deprecated & 1U) == 0) {
      Namer::Method<flatbuffers::FieldDef>
                ((string *)&field_type,&(this->namer_).super_Namer,(FieldDef *)name.field_2._8_8_);
      local_a0 = (Type *)(name.field_2._8_8_ + 200);
      bVar2 = IsScalar(local_a0->base_type);
      uVar1 = type.field_2._8_8_;
      if (bVar2) {
        poVar3 = std::operator<<((ostream *)(stub + 0x10),"  def ");
        poVar3 = std::operator<<(poVar3,(string *)&field_type);
        poVar3 = std::operator<<(poVar3,"(self) -> ");
        (anonymous_namespace)::PythonStubGenerator::TypeOf_abi_cxx11_
                  ((string *)&import,(PythonStubGenerator *)this,local_a0,
                   (Imports *)type.field_2._8_8_);
        std::operator<<(poVar3,(string *)&import);
        std::__cxx11::string::~string((string *)&import);
        bVar2 = FieldDef::IsOptional((FieldDef *)name.field_2._8_8_);
        if (bVar2) {
          std::operator<<((ostream *)(stub + 0x10)," | None");
        }
        std::operator<<((ostream *)(stub + 0x10),": ...\n");
      }
      else {
        switch(local_a0->base_type) {
        case BASE_TYPE_STRING:
          poVar3 = std::operator<<((ostream *)(stub + 0x10),"  def ");
          poVar3 = std::operator<<(poVar3,(string *)&field_type);
          std::operator<<(poVar3,"(self) -> str | None: ...\n");
          break;
        case BASE_TYPE_VECTOR:
        case BASE_TYPE_ARRAY:
          if (local_a0->element == BASE_TYPE_STRING) {
            poVar3 = std::operator<<((ostream *)(stub + 0x10),"  def ");
            poVar3 = std::operator<<(poVar3,(string *)&field_type);
            std::operator<<(poVar3,"(self, i: int) -> str: ...\n");
          }
          else if (local_a0->element == BASE_TYPE_STRUCT) {
            ModuleFor<flatbuffers::StructDef>(&local_150,this,local_a0->struct_def);
            IdlNamer::Type_abi_cxx11_(&local_170,&this->namer_,local_a0->struct_def);
            pIVar6 = Imports::Import((Imports *)uVar1,&local_150,&local_170);
            std::__cxx11::string::~string((string *)&local_170);
            std::__cxx11::string::~string((string *)&local_150);
            local_130 = pIVar6;
            poVar3 = std::operator<<((ostream *)(stub + 0x10),"  def ");
            poVar3 = std::operator<<(poVar3,(string *)&field_type);
            poVar3 = std::operator<<(poVar3,"(self, i: int) -> ");
            poVar3 = std::operator<<(poVar3,(string *)&local_130->name);
            std::operator<<(poVar3," | None: ...\n");
          }
          else {
            poVar3 = std::operator<<((ostream *)(stub + 0x10),"  def ");
            poVar3 = std::operator<<(poVar3,(string *)&field_type);
            poVar3 = std::operator<<(poVar3,"(self, i: int) -> ");
            (anonymous_namespace)::PythonStubGenerator::TypeOf_abi_cxx11_
                      ((string *)&nested_def,(PythonStubGenerator *)this,local_a0,
                       (Imports *)type.field_2._8_8_);
            poVar3 = std::operator<<(poVar3,(string *)&nested_def);
            std::operator<<(poVar3,": ...\n");
            std::__cxx11::string::~string((string *)&nested_def);
            if (((this->parser_->opts).python_gen_numpy & 1U) != 0) {
              poVar3 = std::operator<<((ostream *)(stub + 0x10),"  def ");
              poVar3 = std::operator<<(poVar3,(string *)&field_type);
              std::operator<<(poVar3,"AsNumpy(self) -> np.ndarray: ...\n");
            }
            import_2 = (Import *)GetNestedStruct(this,(FieldDef *)name.field_2._8_8_);
            uVar1 = type.field_2._8_8_;
            if ((StructDef *)import_2 != (StructDef *)0x0) {
              ModuleFor<flatbuffers::StructDef>(&local_1c0,this,(StructDef *)import_2);
              IdlNamer::Type_abi_cxx11_(&local_1e0,&this->namer_,(StructDef *)import_2);
              pIVar6 = Imports::Import((Imports *)uVar1,&local_1c0,&local_1e0);
              std::__cxx11::string::~string((string *)&local_1e0);
              std::__cxx11::string::~string((string *)&local_1c0);
              local_1a0 = pIVar6;
              poVar3 = std::operator<<((ostream *)(stub + 0x10),"  def ");
              std::operator+(&local_200,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &field_type,"NestedRoot(self) -> ");
              poVar3 = std::operator<<(poVar3,(string *)&local_200);
              poVar3 = std::operator<<(poVar3,(string *)&local_1a0->name);
              std::operator<<(poVar3," | None: ...\n");
              std::__cxx11::string::~string((string *)&local_200);
            }
          }
          poVar3 = std::operator<<((ostream *)(stub + 0x10),"  def ");
          poVar3 = std::operator<<(poVar3,(string *)&field_type);
          std::operator<<(poVar3,"Length(self) -> int: ...\n");
          poVar3 = std::operator<<((ostream *)(stub + 0x10),"  def ");
          poVar3 = std::operator<<(poVar3,(string *)&field_type);
          std::operator<<(poVar3,"IsNone(self) -> bool: ...\n");
          break;
        case BASE_TYPE_STRUCT:
          ModuleFor<flatbuffers::StructDef>(&local_e8,this,local_a0->struct_def);
          IdlNamer::Type_abi_cxx11_(&local_108,&this->namer_,local_a0->struct_def);
          pIVar6 = Imports::Import((Imports *)uVar1,&local_e8,&local_108);
          std::__cxx11::string::~string((string *)&local_108);
          std::__cxx11::string::~string((string *)&local_e8);
          local_c8 = pIVar6;
          if ((struct_def->fixed & 1U) == 0) {
            poVar3 = std::operator<<((ostream *)(stub + 0x10),"  def ");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &import_1,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &field_type,"(self) -> ");
            poVar3 = std::operator<<(poVar3,(string *)&import_1);
            poVar3 = std::operator<<(poVar3,(string *)&local_c8->name);
            std::operator<<(poVar3," | None: ...\n");
            std::__cxx11::string::~string((string *)&import_1);
          }
          else {
            poVar3 = std::operator<<((ostream *)(stub + 0x10),"  def ");
            poVar3 = std::operator<<(poVar3,(string *)&field_type);
            poVar3 = std::operator<<(poVar3,"(self, obj: ");
            poVar3 = std::operator<<(poVar3,(string *)&local_c8->name);
            poVar3 = std::operator<<(poVar3,") -> ");
            poVar3 = std::operator<<(poVar3,(string *)&local_c8->name);
            std::operator<<(poVar3,": ...\n");
          }
          break;
        case BASE_TYPE_UNION:
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_220,"flatbuffers",&local_221);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_248,"table",&local_249);
          Imports::Import((Imports *)uVar1,&local_220,&local_248);
          std::__cxx11::string::~string((string *)&local_248);
          std::allocator<char>::~allocator(&local_249);
          std::__cxx11::string::~string((string *)&local_220);
          std::allocator<char>::~allocator(&local_221);
          poVar3 = std::operator<<((ostream *)(stub + 0x10),"  def ");
          poVar3 = std::operator<<(poVar3,(string *)&field_type);
          std::operator<<(poVar3,"(self) -> table.Table | None: ...\n");
        }
      }
      std::__cxx11::string::~string((string *)&field_type);
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&__end3);
  }
  if (((this->parser_->opts).generate_object_based_api & 1U) != 0) {
    GenerateObjectStub(this,stub,struct_def,(Imports *)type.field_2._8_8_);
  }
  if ((struct_def->fixed & 1U) == 0) {
    GenerateTableBuilderStub(this,stub,struct_def,(Imports *)type.field_2._8_8_);
  }
  else {
    GenerateStructBuilderStub(this,stub,struct_def,(Imports *)type.field_2._8_8_);
  }
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void GenerateStructStub(std::stringstream &stub, const StructDef *struct_def,
                          Imports *imports) const {
    std::string type = namer_.Type(*struct_def);

    stub << "class " << type;
    if (version_.major != 3) stub << "(object)";
    stub << ":\n";
    if (struct_def->fixed) {
      stub << "  @classmethod\n";
      stub << "  def SizeOf(cls) -> int: ...\n\n";
    } else {
      stub << "  @classmethod\n";
      stub << "  def GetRootAs(cls, buf: bytes, offset: int) -> " << type
           << ": ...\n";

      if (!parser_.opts.python_no_type_prefix_suffix) {
        stub << "  @classmethod\n";
        stub << "  def GetRootAs" << type
             << "(cls, buf: bytes, offset: int) -> " << type << ": ...\n";
      }
      if (parser_.file_identifier_.length()) {
        stub << "  @classmethod\n";
        stub << "  def " << type
             << "BufferHasIdentifier(cls, buf: bytes, offset: int, "
                "size_prefixed: bool) -> bool: ...\n";
      }
    }

    stub << "  def Init(self, buf: bytes, pos: int) -> None: ...\n";

    for (const FieldDef *field : struct_def->fields.vec) {
      if (field->deprecated) continue;

      std::string name = namer_.Method(*field);

      const Type &field_type = field->value.type;
      if (IsScalar(field_type.base_type)) {
        stub << "  def " << name << "(self) -> " << TypeOf(field_type, imports);
        if (field->IsOptional()) stub << " | None";
        stub << ": ...\n";
      } else {
        switch (field_type.base_type) {
          case BASE_TYPE_STRUCT: {
            const Import &import =
                imports->Import(ModuleFor(field_type.struct_def),
                                namer_.Type(*field_type.struct_def));
            if (struct_def->fixed) {
              stub << "  def " << name << "(self, obj: " << import.name
                   << ") -> " << import.name << ": ...\n";
            } else {
              stub << "  def " << name + "(self) -> " << import.name
                   << " | None: ...\n";
            }
            break;
          }
          case BASE_TYPE_STRING:
            stub << "  def " << name << "(self) -> str | None: ...\n";
            break;
          case BASE_TYPE_ARRAY:
          case BASE_TYPE_VECTOR: {
            switch (field_type.element) {
              case BASE_TYPE_STRUCT: {
                const Import &import =
                    imports->Import(ModuleFor(field_type.struct_def),
                                    namer_.Type(*field_type.struct_def));
                stub << "  def " << name << "(self, i: int) -> " << import.name
                     << " | None: ...\n";
                break;
              }
              case BASE_TYPE_STRING:
                stub << "  def " << name << "(self, i: int) -> str: ...\n";
                break;
              default:  // scalars
                stub << "  def " << name << "(self, i: int) -> "
                     << TypeOf(field_type, imports) << ": ...\n";

                if (parser_.opts.python_gen_numpy) {
                  stub << "  def " << name
                       << "AsNumpy(self) -> np.ndarray: ...\n";
                }

                const StructDef *nested_def = GetNestedStruct(field);
                if (nested_def != nullptr) {
                  const Import &import = imports->Import(
                      ModuleFor(nested_def), namer_.Type(*nested_def));

                  stub << "  def " << name + "NestedRoot(self) -> "
                       << import.name << " | None: ...\n";
                }
                break;
            }
            stub << "  def " << name << "Length(self) -> int: ...\n";
            stub << "  def " << name << "IsNone(self) -> bool: ...\n";
            break;
          }
          case BASE_TYPE_UNION: {
            imports->Import("flatbuffers", "table");
            stub << "  def " << name << "(self) -> table.Table | None: ...\n";
            break;
          }
          default:
            break;
        }
      }
    }

    if (parser_.opts.generate_object_based_api) {
      GenerateObjectStub(stub, struct_def, imports);
    }

    if (struct_def->fixed) {
      GenerateStructBuilderStub(stub, struct_def, imports);
    } else {
      GenerateTableBuilderStub(stub, struct_def, imports);
    }
  }